

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O3

void __thiscall serial::Serial::SerialImpl::setRTS(SerialImpl *this,bool level)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  SerialException *pSVar5;
  PortNotOpenedException *this_00;
  int command;
  stringstream ss;
  undefined4 local_1c4;
  char *local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (this->is_open_ == false) {
    this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x28);
    PortNotOpenedException::PortNotOpenedException(this_00,"Serial::setRTS");
    __cxa_throw(this_00,&PortNotOpenedException::typeinfo,
                PortNotOpenedException::~PortNotOpenedException);
  }
  local_1c4 = 4;
  if (level) {
    iVar1 = ioctl(this->fd_,0x5416,&local_1c4);
    if (iVar1 == -1) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_190,"setRTS failed on a call to ioctl(TIOCMBIS): ",0x2c);
      piVar2 = __errno_location();
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,*piVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar4 = strerror(*piVar2);
      std::operator<<(poVar3,pcVar4);
      pSVar5 = (SerialException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      SerialException::SerialException(pSVar5,local_1c0);
      __cxa_throw(pSVar5,&SerialException::typeinfo,SerialException::~SerialException);
    }
  }
  else {
    iVar1 = ioctl(this->fd_,0x5417,&local_1c4);
    if (iVar1 == -1) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_190,"setRTS failed on a call to ioctl(TIOCMBIC): ",0x2c);
      piVar2 = __errno_location();
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,*piVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar4 = strerror(*piVar2);
      std::operator<<(poVar3,pcVar4);
      pSVar5 = (SerialException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      SerialException::SerialException(pSVar5,local_1c0);
      __cxa_throw(pSVar5,&SerialException::typeinfo,SerialException::~SerialException);
    }
  }
  return;
}

Assistant:

void
Serial::SerialImpl::setRTS (bool level)
{
  if (is_open_ == false) {
    throw PortNotOpenedException ("Serial::setRTS");
  }

  int command = TIOCM_RTS;

  if (level) {
    if (-1 == ioctl (fd_, TIOCMBIS, &command))
    {
      stringstream ss;
      ss << "setRTS failed on a call to ioctl(TIOCMBIS): " << errno << " " << strerror(errno);
      throw(SerialException(ss.str().c_str()));
    }
  } else {
    if (-1 == ioctl (fd_, TIOCMBIC, &command))
    {
      stringstream ss;
      ss << "setRTS failed on a call to ioctl(TIOCMBIC): " << errno << " " << strerror(errno);
      throw(SerialException(ss.str().c_str()));
    }
  }
}